

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

void __thiscall tinyxml2::XMLDocument::DeepCopy(XMLDocument *this,XMLDocument *target)

{
  XMLNode *this_00;
  XMLNode *addThis;
  XMLNode **ppXVar1;
  
  if (target != this) {
    Clear(target);
    ppXVar1 = &(this->super_XMLNode)._firstChild;
    while (this_00 = *ppXVar1, this_00 != (XMLNode *)0x0) {
      addThis = XMLNode::DeepClone(this_00,target);
      XMLNode::InsertEndChild(&target->super_XMLNode,addThis);
      ppXVar1 = &this_00->_next;
    }
  }
  return;
}

Assistant:

void XMLDocument::DeepCopy(XMLDocument* target) const
{
	TIXMLASSERT(target);
    if (target == this) {
        return; // technically success - a no-op.
    }

	target->Clear();
	for (const XMLNode* node = this->FirstChild(); node; node = node->NextSibling()) {
		target->InsertEndChild(node->DeepClone(target));
	}
}